

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
booster::locale::basic_format<char>::add(basic_format<char> *this,formattible_type *param)

{
  writer_type p_Var1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = this->parameters_count_;
  uVar3 = (ulong)uVar2;
  if (uVar3 < 8) {
    if (this->parameters_ + uVar3 != param) {
      p_Var1 = param->writer_;
      this->parameters_[uVar3].pointer_ = param->pointer_;
      this->parameters_[uVar3].writer_ = p_Var1;
    }
  }
  else {
    std::
    vector<booster::locale::details::formattible<char>,_std::allocator<booster::locale::details::formattible<char>_>_>
    ::push_back(&this->ext_params_,param);
    uVar2 = this->parameters_count_;
  }
  this->parameters_count_ = uVar2 + 1;
  return;
}

Assistant:

void add(formattible_type const &param)
            {
                if(parameters_count_ >= base_params_)
                    ext_params_.push_back(param);
                else 
                    parameters_[parameters_count_] = param;
                parameters_count_++;
            }